

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int skip_mv_cost_update(AV1_COMP *cpi,TileInfo *tile_info,int mi_row,int mi_col)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  TileInfo *in_RSI;
  long in_RDI;
  AV1_COMMON *cm;
  undefined4 local_4;
  
  iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  if (iVar1 == 0) {
    local_4 = skip_cost_update(*(SequenceHeader **)(in_RDI + 0x42008),in_RSI,in_EDX,in_ECX,
                               *(INTERNAL_COST_UPDATE_TYPE *)(in_RDI + 0x60b00));
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int skip_mv_cost_update(AV1_COMP *cpi, const TileInfo *const tile_info,
                               const int mi_row, const int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  // For intra frames, mv cdfs are not updated during the encode. Hence, the mv
  // cost calculation is skipped in this case.
  if (frame_is_intra_only(cm)) return 1;

  return skip_cost_update(cm->seq_params, tile_info, mi_row, mi_col,
                          cpi->sf.inter_sf.mv_cost_upd_level);
}